

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::CellConservativeLinear::interp(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::RunOn)::__2>
               (Box *bx,int ncomp,anon_class_224_7_6f8cafc1 *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  anon_class_224_7_6f8cafc1 *in_RDX;
  int in_ESI;
  int *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  iVar5 = in_RDI[4];
  iVar6 = in_RDI[5];
  for (local_104 = 0; local_108 = iVar3, local_104 < in_ESI; local_104 = local_104 + 1) {
    for (; local_10c = iVar2, local_108 <= iVar6; local_108 = local_108 + 1) {
      for (; local_110 = iVar1, local_10c <= iVar5; local_10c = local_10c + 1) {
        for (; local_110 <= iVar4; local_110 = local_110 + 1) {
          CellConservativeLinear::interp::anon_class_224_7_6f8cafc1::operator()
                    (in_RDX,local_110,local_10c,local_108,local_104);
        }
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, int ncomp, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int n = 0; n < ncomp; ++n) {
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k,n);
    }}}}
}